

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::FieldMap(FieldMap *this,FieldMap *copy)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_001fcc08;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_order).m_mode = normal;
  *(undefined8 *)&(this->m_order).m_delim = 0;
  *(undefined8 *)((long)&(this->m_order).m_groupOrder.m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_order).m_groupOrder.m_buffer + 4) = 0;
  operator=(this,copy);
  return;
}

Assistant:

FieldMap::FieldMap(const FieldMap &copy) { *this = copy; }